

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

void __thiscall kj::anon_unknown_35::InMemoryFile::~InMemoryFile(InMemoryFile *this)

{
  uchar *puVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  
  puVar1 = (this->impl).value.bytes.ptr;
  if (puVar1 != (uchar *)0x0) {
    sVar2 = (this->impl).value.bytes.size_;
    (this->impl).value.bytes.ptr = (uchar *)0x0;
    (this->impl).value.bytes.size_ = 0;
    pAVar3 = (this->impl).value.bytes.disposer;
    (**pAVar3->_vptr_ArrayDisposer)(pAVar3,puVar1,1,sVar2,sVar2,0);
  }
  kj::_::Mutex::~Mutex(&(this->impl).mutex);
  AtomicRefcounted::~AtomicRefcounted(&this->super_AtomicRefcounted);
  operator_delete(this,0x68);
  return;
}

Assistant:

InMemoryFile(const Clock& clock): impl(clock) {}